

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O0

void __thiscall Spectrum_MaxValue_Test::Spectrum_MaxValue_Test(Spectrum_MaxValue_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__Spectrum_MaxValue_Test_037472c0;
  return;
}

Assistant:

TEST(Spectrum, MaxValue) {
    EXPECT_EQ(2.5, ConstantSpectrum(2.5).MaxValue());

    EXPECT_EQ(Float(10.1),
              PiecewiseLinearSpectrum(
                  {Float(300), Float(380), Float(510), Float(662), Float(700)},
                  {Float(1.5), Float(2.6), Float(10.1), Float(5.3), Float(7.7)})
                  .MaxValue());

    EXPECT_GT(BlackbodySpectrum(5000).MaxValue(), .9999);
    EXPECT_LT(BlackbodySpectrum(5000).MaxValue(), 1.0001);

    BlackbodySpectrum bb(5000);
    EXPECT_GT(DenselySampledSpectrum(&bb).MaxValue(), .9999);
    EXPECT_LT(DenselySampledSpectrum(&bb).MaxValue(), 1.0001);

    RNG rng;
    for (int i = 0; i < 20; ++i) {
        RGB rgb(rng.Uniform<Float>(), rng.Uniform<Float>(), rng.Uniform<Float>());
        RGBReflectanceSpectrum sr(*RGBColorSpace::sRGB, rgb);
        Float m = sr.MaxValue() * 1.00001f;
        for (Float lambda = 360; lambda < 830; lambda += .92)
            EXPECT_LE(sr(lambda), m);

        RGBSpectrum si(*RGBColorSpace::sRGB, rgb);
        m = si.MaxValue() * 1.00001f;
        for (Float lambda = 360; lambda < 830; lambda += .92)
            EXPECT_LE(si(lambda), m);
    }
}